

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O1

bool_t prf_texture_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  int32_t iVar2;
  uint8_t *puVar3;
  uint len;
  bool_t bVar4;
  uint uVar5;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_texture_info.opcode) {
    uVar1 = bf_get_uint16_be(bfile);
    node->length = uVar1;
    if (4 < uVar1 && node->data == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar3 = (uint8_t *)malloc((ulong)(uVar1 - 4));
      }
      else {
        puVar3 = (uint8_t *)pool_malloc(pool_id,uVar1 - 4);
      }
      node->data = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar5 = 4;
        goto LAB_0010978e;
      }
    }
    uVar5 = 4;
    if (0xcb < node->length) {
      puVar3 = node->data;
      bf_read(bfile,puVar3,200);
      uVar5 = 0xcc;
      if (0xcf < node->length) {
        iVar2 = bf_get_int32_be(bfile);
        *(int32_t *)(puVar3 + 200) = iVar2;
        uVar5 = 0xd0;
        if (0xd3 < node->length) {
          iVar2 = bf_get_int32_be(bfile);
          *(int32_t *)(puVar3 + 0xcc) = iVar2;
          uVar5 = 0xd4;
          if (0xd7 < node->length) {
            iVar2 = bf_get_int32_be(bfile);
            *(int32_t *)(puVar3 + 0xd0) = iVar2;
            uVar5 = 0xd8;
          }
        }
      }
    }
    bVar4 = 1;
    len = node->length - uVar5;
    if (uVar5 <= node->length && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar5 - 4),len);
    }
  }
  else {
    prf_error(9,"tried to use texture load method on node of type %d.",(ulong)uVar1);
    uVar5 = 2;
LAB_0010978e:
    bVar4 = 0;
    bf_rewind(bfile,uVar5);
  }
  return bVar4;
}

Assistant:

static bool_t
prf_texture_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile)
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_texture_info.opcode ) {
        prf_error( 9, "tried to use texture load method on node of type %d.",
                   node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }
    node->length = bf_get_uint16_be( bfile );

    if ( node->data == NULL && node->length > 4 ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data =
                (uint8_t *) malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data =
                (uint8_t *) pool_malloc( state->model->mempool_id,
                                         node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }
  
    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 200) ) break;
        bf_read( bfile, (unsigned char*) data->filename, 200 ); pos += 200;
        if ( node->length < (pos + 4) ) break;
        data->pattern_index = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->x_location = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->y_location = bf_get_int32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
                        node->length - pos );
    return TRUE;
}